

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# potion.c
# Opt level: O1

void make_confused(long xtime,boolean talk)

{
  uint uVar1;
  boolean bVar2;
  long lVar3;
  char *pcVar4;
  bool bVar5;
  
  uVar1 = u.uprops[0x1c].intrinsic;
  bVar5 = u.uprops[0x1c].intrinsic != 0;
  if (talk != '\0' && (bVar5 && xtime == 0)) {
    pcVar4 = "confused";
    if ((u.uprops[0x23].intrinsic != 0) && (u.uprops[0x24].extrinsic == 0)) {
      if (u.umonnum == u.umonster) {
        pcVar4 = "trippy";
      }
      else {
        bVar2 = dmgtype(youmonst.data,0x24);
        pcVar4 = "confused";
        if (bVar2 == '\0') {
          pcVar4 = "trippy";
        }
      }
    }
    pline("You feel less %s now.",pcVar4);
  }
  if (bVar5 && xtime == 0 || xtime != 0 && uVar1 == 0) {
    iflags.botl = '\x01';
  }
  lVar3 = 0;
  if (0 < xtime) {
    lVar3 = xtime;
  }
  if (0xfffffe < lVar3) {
    lVar3 = 0xffffff;
  }
  u.uprops[0x1c].intrinsic = (uint)lVar3 | u.uprops[0x1c].intrinsic & 0xff000000;
  return;
}

Assistant:

void make_confused(long xtime, boolean talk)
{
	long old = HConfusion;

	if (!xtime && old) {
		if (talk)
		    pline("You feel less %s now.",
			Hallucination ? "trippy" : "confused");
	}
	if ((xtime && !old) || (!xtime && old)) iflags.botl = TRUE;

	set_itimeout(&HConfusion, xtime);
}